

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O3

TsStatus_t ts_message_get(TsMessageRef_t message,TsPathNode_t field,TsMessageRef_t_conflict *value)

{
  TsMessageRef_t_conflict pTVar1;
  int iVar2;
  TsStatus_t TVar3;
  long lVar4;
  
  TVar3 = TsStatusErrorPreconditionFailed;
  if ((value != (TsMessageRef_t_conflict *)0x0 &&
       (field != (TsPathNode_t)0x0 && message != (TsMessageRef_t)0x0)) &&
     (message->type == TsTypeMessage)) {
    lVar4 = 0;
    TVar3 = TsStatusErrorNotFound;
    do {
      pTVar1 = *(TsMessageRef_t_conflict *)(message->name + lVar4 * 8 + 0x1c);
      if (pTVar1 == (TsMessageRef_t_conflict)0x0) {
        return TsStatusErrorNotFound;
      }
      iVar2 = strcmp(pTVar1->name,field);
      if (iVar2 == 0) {
        *value = pTVar1;
        return TsStatusOk;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xf);
  }
  return TVar3;
}

Assistant:

static TsStatus_t _ts_message_get(TsMessageRef_t message, TsPathNode_t field, TsType_t type, TsValue_t value)
{
	TsMessageRef_t object;
	if (ts_message_has(message, field, &object) == TsStatusOk) {

		/* automatic type promotion */
		switch (object->type) {

		case TsTypeInteger: {
			switch (type) {
			case TsTypeInteger:
				*((int *) (value)) = object->value._xinteger;
				return TsStatusOk;
			case TsTypeFloat:
				*((float *) (value)) = (float) (object->value._xinteger);
				return TsStatusOk;
			default:
				return TsStatusErrorPreconditionFailed;
			}
		}

		case TsTypeFloat: {
			switch (type) {
			case TsTypeInteger:
				*((int *) (value)) = (int) (object->value._xfloat);
				return TsStatusOk;
			case TsTypeFloat:
				*((float *) (value)) = object->value._xfloat;
				return TsStatusOk;
			default:
				return TsStatusErrorPreconditionFailed;
			}
		}

		default:
			/* do nothing */
			break;
		}

		/* strict type checks, no promotion */
		if (type != object->type) {
			return TsStatusErrorPreconditionFailed;
		}
		switch (object->type) {

		case TsTypeBoolean:
			*((bool *) (value)) = object->value._xboolean;
			return TsStatusOk;

		case TsTypeString:
			*((char **) (value)) = object->value._xstring;
			return TsStatusOk;

		case TsTypeMessage:
		case TsTypeArray:
			*((TsMessageRef_t *) (value)) = object;
			return TsStatusOk;

		default:
			/* do nothing */
			break;
		}

		/* type not matched (e.g., null) */
		return TsStatusErrorPreconditionFailed;
	}

	/* field not found */
	return TsStatusErrorNotFound;
}